

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::javanano::BoxedPrimitiveTypeName_abi_cxx11_
          (string *__return_storage_ptr__,javanano *this,JavaType type)

{
  LogMessage *other;
  allocator local_6a;
  LogFinisher local_69;
  LogMessage local_68;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  undefined4 local_14;
  string *psStack_10;
  JavaType type_local;
  
  local_14 = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xffffffff) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"java.lang.Integer",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"java.lang.Long",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"java.lang.Float",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"java.lang.Double",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"java.lang.Boolean",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"java.lang.String",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"byte[]",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"java.lang.Integer",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_helpers.cc"
               ,0x17b);
    other = internal::LogMessage::operator<<(&local_68,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_69,other);
    internal::LogMessage::~LogMessage(&local_68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_6a);
    std::allocator<char>::~allocator((allocator<char> *)&local_6a);
  }
  return __return_storage_ptr__;
}

Assistant:

string BoxedPrimitiveTypeName(JavaType type) {
  switch (type) {
    case JAVATYPE_INT    : return "java.lang.Integer";
    case JAVATYPE_LONG   : return "java.lang.Long";
    case JAVATYPE_FLOAT  : return "java.lang.Float";
    case JAVATYPE_DOUBLE : return "java.lang.Double";
    case JAVATYPE_BOOLEAN: return "java.lang.Boolean";
    case JAVATYPE_STRING : return "java.lang.String";
    case JAVATYPE_BYTES  : return "byte[]";
    case JAVATYPE_ENUM   : return "java.lang.Integer";
    case JAVATYPE_MESSAGE: return "";

    // No default because we want the compiler to complain if any new
    // JavaTypes are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}